

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIBImporter.cpp
# Opt level: O2

SIBChunk ReadChunk(StreamReaderLE *stream)

{
  uint uVar1;
  uint uVar2;
  Logger *this;
  SIBChunk SVar3;
  
  uVar1 = Assimp::StreamReader<false,_false>::Get<unsigned_int>(stream);
  uVar2 = Assimp::StreamReader<false,_false>::Get<unsigned_int>(stream);
  if ((uint)(*(int *)&stream->limit - *(int *)&stream->current) < uVar2) {
    this = Assimp::DefaultLogger::get();
    Assimp::Logger::error(this,"SIB: Chunk overflow");
  }
  SVar3.Tag = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  SVar3.Size = uVar2;
  return SVar3;
}

Assistant:

static SIBChunk ReadChunk(StreamReaderLE* stream)
{
    SIBChunk chunk;
    chunk.Tag = stream->GetU4();
    chunk.Size = stream->GetU4();
    if (chunk.Size > stream->GetRemainingSizeToLimit())
        ASSIMP_LOG_ERROR("SIB: Chunk overflow");
    ByteSwap::Swap4(&chunk.Tag);
    return chunk;
}